

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall
ncnn::Net::register_custom_layer
          (Net *this,int index,layer_creator_func creator,layer_destroyer_func destroyer,
          void *userdata)

{
  NetPrivate *pNVar1;
  pointer pcVar2;
  int iVar3;
  uint uVar4;
  custom_layer_registry_entry dummy;
  value_type local_58;
  
  uVar4 = index & 0xfffffeff;
  if (uVar4 == index) {
    register_custom_layer((Net *)(ulong)uVar4);
    iVar3 = -1;
  }
  else {
    pNVar1 = this->d;
    if ((int)((ulong)((long)(pNVar1->custom_layer_registry).
                            super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pNVar1->custom_layer_registry).
                           super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) <= (int)uVar4) {
      local_58.destroyer = (layer_destroyer_func)0x0;
      local_58.userdata = (void *)0x0;
      local_58.name = "";
      local_58.creator = (layer_creator_func)0x0;
      std::
      vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
      ::resize(&pNVar1->custom_layer_registry,(long)(int)(uVar4 + 1),&local_58);
    }
    if ((this->d->custom_layer_registry).
        super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
        ._M_impl.super__Vector_impl_data._M_start[(int)uVar4].creator != (layer_creator_func)0x0) {
      register_custom_layer((Net *)(ulong)uVar4);
    }
    pcVar2 = (this->d->custom_layer_registry).
             super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar2[(int)uVar4].creator = creator;
    pcVar2[(int)uVar4].destroyer = destroyer;
    pcVar2[(int)uVar4].userdata = userdata;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int Net::register_custom_layer(int index, layer_creator_func creator, layer_destroyer_func destroyer, void* userdata)
{
    int custom_index = index & ~LayerType::CustomBit;
    if (index == custom_index)
    {
        NCNN_LOGE("can not register build-in layer index %d", custom_index);
        return -1;
    }

    if ((int)d->custom_layer_registry.size() <= custom_index)
    {
#if NCNN_STRING
        struct custom_layer_registry_entry dummy = {"", 0, 0, 0};
#else
        struct custom_layer_registry_entry dummy = {0, 0, 0};
#endif // NCNN_STRING
        d->custom_layer_registry.resize(custom_index + 1, dummy);
    }

    if (d->custom_layer_registry[custom_index].creator)
    {
        NCNN_LOGE("overwrite existing custom layer index %d", custom_index);
    }

    d->custom_layer_registry[custom_index].creator = creator;
    d->custom_layer_registry[custom_index].destroyer = destroyer;
    d->custom_layer_registry[custom_index].userdata = userdata;
    return 0;
}